

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_shm.c
# Opt level: O3

int test_shm(void)

{
  int iVar1;
  QcShm *qcShm;
  char *pcVar2;
  QcShm *qcShm_00;
  int iVar3;
  QcErr err;
  QcErr local_11c;
  
  qcShm = qc_shm_create("test_shm_1",0xa00000,&local_11c);
  iVar3 = -1;
  if (qcShm == (QcShm *)0x0) {
    pcVar2 = "create shm failed.";
  }
  else {
    pcVar2 = qc_shm_getaddr(qcShm);
    builtin_strncpy(pcVar2,"123456",7);
    qcShm_00 = qc_shm_open("test_shm_1",&local_11c);
    if (qcShm_00 == (QcShm *)0x0) {
      pcVar2 = "open shm failed.";
    }
    else {
      pcVar2 = qc_shm_getaddr(qcShm_00);
      iVar1 = strcmp(pcVar2,"123456");
      if (iVar1 == 0) {
        qc_shm_close(qcShm_00);
        qc_shm_destroy(qcShm);
        iVar3 = 0;
        pcVar2 = "test shm ok.";
      }
      else {
        pcVar2 = "shm content compare failed.";
      }
    }
  }
  puts(pcVar2);
  return iVar3;
}

Assistant:

int test_shm()
{
	QcErr err;
	QcShm *qcShm1;
	QcShm *qcShm2;


	qcShm1 = qc_shm_create("test_shm_1", 10 * 1024 * 1024, &err);
	if (NULL == qcShm1)
	{
		printf("create shm failed.\n");
		return -1;
	}

	char *addr1 = qc_shm_getaddr(qcShm1);
	strcpy(addr1, "123456");

	qcShm2 = qc_shm_open("test_shm_1", &err);
	if(NULL == qcShm2)
	{
		printf("open shm failed.\n");
		return -1;
	}

	char *addr2 = qc_shm_getaddr(qcShm2);

	if (0 != strcmp(addr2, "123456"))
	{
		printf("shm content compare failed.\n");
		return -1;
	}

	qc_shm_close(qcShm2);
	qc_shm_destroy(qcShm1);

	printf("test shm ok.\n");
	return 0;
}